

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshotExtractor.cpp
# Opt level: O3

void __thiscall
TTD::SnapshotExtractor::ExtractScopeIfNeeded
          (SnapshotExtractor *this,ScriptContext *ctx,FrameDisplay *environment)

{
  int32 iVar1;
  ScopeType SVar2;
  ScriptFunctionScopeInfo *pSVar3;
  SlabAllocator *this_00;
  ScopeInfoEntry *pSVar4;
  Type *scope;
  long lVar5;
  ulong uVar6;
  
  iVar1 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)environment);
  if ((this->m_marks).m_markArray[iVar1] != Clear) {
    if (environment->length == 0) {
      TTDAbort_unrecoverable_error("This doesn\'t make sense");
    }
    pSVar3 = SnapShot::GetNextAvailableFunctionScopeEntry(this->m_pendingSnap);
    pSVar3->ScopeId = (TTD_PTR_ID)environment;
    pSVar3->ScriptContextLogId = ctx->ScriptContextLogTag;
    pSVar3->ScopeCount = environment->length;
    this_00 = SnapShot::GetSnapshotSlabAllocator(this->m_pendingSnap);
    pSVar4 = SlabAllocatorBase<0>::SlabAllocateArray<TTD::NSSnapValues::ScopeInfoEntry>
                       (this_00,(ulong)pSVar3->ScopeCount);
    pSVar3->ScopeArray = pSVar4;
    if (pSVar3->ScopeCount != 0) {
      lVar5 = 8;
      uVar6 = 0;
      do {
        scope = (Type *)Js::FrameDisplay::GetItem(environment,(uint)uVar6);
        pSVar4 = pSVar3->ScopeArray;
        SVar2 = Js::FrameDisplay::GetScopeType(scope);
        *(ScopeType *)((long)pSVar4 + lVar5 + -8) = SVar2;
        if ((SVar2 != ScopeType_ActivationObject) && (SVar2 != ScopeType_WithScope)) {
          if (SVar2 != ScopeType_SlotArray) {
            TTDAbort_unrecoverable_error("Unknown scope kind");
          }
          ExtractSlotArrayIfNeeded(this,ctx,scope);
        }
        *(Type **)((long)&pSVar4->Tag + lVar5) = scope;
        uVar6 = uVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (uVar6 < pSVar3->ScopeCount);
    }
    iVar1 = MarkTable::FindIndexForKey(&this->m_marks,(uint64)environment);
    (this->m_marks).m_markArray[iVar1] = Clear;
  }
  return;
}

Assistant:

void SnapshotExtractor::ExtractScopeIfNeeded(Js::ScriptContext* ctx, Js::FrameDisplay* environment)
    {
        if(this->m_marks.IsMarked(environment))
        {
            TTDAssert(environment->GetLength() > 0, "This doesn't make sense");

            NSSnapValues::ScriptFunctionScopeInfo* funcScopeInfo = this->m_pendingSnap->GetNextAvailableFunctionScopeEntry();
            funcScopeInfo->ScopeId = TTD_CONVERT_ENV_TO_PTR_ID(environment);
            funcScopeInfo->ScriptContextLogId = ctx->ScriptContextLogTag;

            funcScopeInfo->ScopeCount = environment->GetLength();
            funcScopeInfo->ScopeArray = this->m_pendingSnap->GetSnapshotSlabAllocator().SlabAllocateArray<NSSnapValues::ScopeInfoEntry>(funcScopeInfo->ScopeCount);

            for(uint16 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                void* scope = environment->GetItem(i);
                NSSnapValues::ScopeInfoEntry* entryInfo = (funcScopeInfo->ScopeArray + i);

                entryInfo->Tag = environment->GetScopeType(scope);
                switch(entryInfo->Tag)
                {
                case Js::ScopeType::ScopeType_ActivationObject:
                case Js::ScopeType::ScopeType_WithScope:
                    entryInfo->IDValue = TTD_CONVERT_VAR_TO_PTR_ID((Js::Var)scope);
                    break;
                case Js::ScopeType::ScopeType_SlotArray:
                {
                    this->ExtractSlotArrayIfNeeded(ctx, (Field(Js::Var)*)scope);

                    entryInfo->IDValue = TTD_CONVERT_SLOTARRAY_TO_PTR_ID((Js::Var*)scope);
                    break;
                }
                default:
                    TTDAssert(false, "Unknown scope kind");
                    entryInfo->IDValue = TTD_INVALID_PTR_ID;
                    break;
                }
            }

            this->m_marks.ClearMark(environment);
        }
    }